

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * Extra_bddGetOneCube(DdManager *dd,DdNode *bFunc)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  uint *puVar3;
  
  puVar3 = (uint *)((ulong)bFunc & 0xfffffffffffffffe);
  if (*puVar3 != 0x7fffffff) {
    pDVar1 = *(DdNode **)(puVar3 + 6);
    if (((ulong)bFunc & 1) == 0) {
      pDVar2 = *(DdNode **)(puVar3 + 4);
    }
    else {
      pDVar1 = (DdNode *)((ulong)pDVar1 ^ 1);
      pDVar2 = (DdNode *)(*(ulong *)(puVar3 + 4) ^ 1);
    }
    pDVar1 = Extra_bddGetOneCube(dd,pDVar1);
    Cudd_Ref(pDVar1);
    if (pDVar1 == (DdNode *)((ulong)dd->one ^ 1)) {
      Cudd_RecursiveDeref(dd,pDVar1);
      pDVar1 = Extra_bddGetOneCube(dd,pDVar2);
      Cudd_Ref(pDVar1);
      if (pDVar1 == (DdNode *)((ulong)dd->one ^ 1)) {
        __assert_fail("bRes1 != b0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                      ,0x2a7,"DdNode *Extra_bddGetOneCube(DdManager *, DdNode *)");
      }
      pDVar2 = dd->vars[*puVar3];
    }
    else {
      pDVar2 = (DdNode *)((ulong)dd->vars[*puVar3] ^ 1);
    }
    bFunc = Cudd_bddAnd(dd,pDVar1,pDVar2);
    Cudd_Ref(bFunc);
    Cudd_RecursiveDeref(dd,pDVar1);
    Cudd_Deref(bFunc);
  }
  return bFunc;
}

Assistant:

DdNode * Extra_bddGetOneCube( DdManager * dd, DdNode * bFunc )
{
    DdNode * bFuncR, * bFunc0, * bFunc1;
    DdNode * bRes0,  * bRes1,  * bRes;

    bFuncR = Cudd_Regular(bFunc);
    if ( cuddIsConstant(bFuncR) )
        return bFunc;

    // cofactor
    if ( Cudd_IsComplement(bFunc) )
    {
        bFunc0 = Cudd_Not( cuddE(bFuncR) );
        bFunc1 = Cudd_Not( cuddT(bFuncR) );
    }
    else
    {
        bFunc0 = cuddE(bFuncR);
        bFunc1 = cuddT(bFuncR);
    }

    // try to find the cube with the negative literal
    bRes0 = Extra_bddGetOneCube( dd, bFunc0 );  Cudd_Ref( bRes0 );

    if ( bRes0 != b0 )
    {
        bRes = Cudd_bddAnd( dd, bRes0, Cudd_Not(dd->vars[bFuncR->index]) ); Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bRes0 );
    }
    else
    {
        Cudd_RecursiveDeref( dd, bRes0 );
        // try to find the cube with the positive literal
        bRes1 = Extra_bddGetOneCube( dd, bFunc1 );  Cudd_Ref( bRes1 );
        assert( bRes1 != b0 );
        bRes = Cudd_bddAnd( dd, bRes1, dd->vars[bFuncR->index] ); Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bRes1 );
    }

    Cudd_Deref( bRes );
    return bRes;
}